

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

void __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
::Clear(RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
        *this)

{
  HashElement *pHVar1;
  long lVar2;
  RTPMemoryManager *in_RDX;
  RTPMemoryManager *extraout_RDX;
  HashElement *this_00;
  
  for (lVar2 = 2; lVar2 != 0x207f; lVar2 = lVar2 + 1) {
    this->table[lVar2 + -2] = (HashElement *)0x0;
  }
  this_00 = this->firsthashelem;
  while (this_00 != (HashElement *)0x0) {
    pHVar1 = this_00->listnext;
    RTPDelete<jrtplib::RTPHashTable<jrtplib::RTPIPv4Destination_const,jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,8317>::HashElement>
              ((jrtplib *)this_00,(HashElement *)(this->super_RTPMemoryObject).mgr,in_RDX);
    in_RDX = extraout_RDX;
    this_00 = pHVar1;
  }
  this->firsthashelem = (HashElement *)0x0;
  this->lasthashelem = (HashElement *)0x0;
  return;
}

Assistant:

inline void RTPHashTable<Element,GetIndex,hashsize>::Clear()
{
	HashElement *tmp1,*tmp2;
	
	for (int i = 0 ; i < hashsize ; i++)
		table[i] = 0;
	
	tmp1 = firsthashelem;
	while (tmp1 != 0)
	{
		tmp2 = tmp1->listnext;
		RTPDelete(tmp1,GetMemoryManager());
		tmp1 = tmp2;
	}
	firsthashelem = 0;
	lasthashelem = 0;
}